

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O0

void soul::SanityCheckPass::checkArraySubscript(ArrayElementRef *s)

{
  bool bVar1;
  Expression *e;
  pool_ptr<soul::AST::Expression> local_18;
  ArrayElementRef *local_10;
  ArrayElementRef *s_local;
  
  local_18.object = (s->object).object;
  local_10 = s;
  bVar1 = AST::isResolvedAsEndpoint(&local_18);
  pool_ptr<soul::AST::Expression>::~pool_ptr(&local_18);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    e = pool_ptr<soul::AST::Expression>::operator*(&local_10->object);
    throwErrorIfNotArrayOrVector(e);
  }
  return;
}

Assistant:

static void checkArraySubscript (AST::ArrayElementRef& s)
    {
        if (! AST::isResolvedAsEndpoint (s.object))
            throwErrorIfNotArrayOrVector (*s.object);
    }